

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::rollDiceSequence(Dice *this)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  this->numberOfRolls = 3;
  poVar2 = std::operator<<((ostream *)&std::cout,"Rolling first hand of dice for player");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->playerNumber);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Press enter to continue");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::istream::ignore();
  iVar3 = 6;
  while( true ) {
    rollDice(this,iVar3);
    iVar3 = this->numberOfRolls;
    this->numberOfRolls = iVar3 + -1;
    if (1 < iVar3 - 2U) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Sequence number ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->numberOfRolls);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = addToCount(this);
    poVar2 = std::operator<<((ostream *)&std::cout,"Rolling ");
    iVar3 = 6 - iVar1;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
    poVar2 = std::operator<<(poVar2," dice since you saved: ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::operator<<(poVar2,"\n");
  }
  if (iVar3 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n No hands left: Resolving ......");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::_Rb_tree(&local_60,&(this->resolvedHand)._M_t);
    std::
    vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
    ::push_back(&this->historyOfResolvedRolls,(value_type *)&local_60);
    std::
    _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::~_Rb_tree(&local_60);
    resetResolvedHand(this);
    resetDiceValuesMap(this);
    std::
    vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
    ::clear(&this->historyOfRolls);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Resolved Final Values ---------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    diceHistoricalResolvedValues(this);
  }
  return;
}

Assistant:

void Dice::rollDiceSequence() {
    resetDiceRolls();

    cout << "Rolling first hand of dice for player" << this->getPlayerNumber() << "\n";
    cout << "Press enter to continue" << endl;
    cin.ignore();
    this->rollDice(6);
    numberOfRolls--;

    while (getNumbOfRollsRemaining() == 1 || getNumbOfRollsRemaining() == 2) {         // roll 2
        cout << "Sequence number " << getNumbOfRollsRemaining() << endl;
        int count =0;
        count = addToCount();
        cout << "Rolling " << (6-count) << " dice since you saved: " << count << "\n";

        this->rollDice(6-count);
        numberOfRolls--;
    }

    if (getNumbOfRollsRemaining() == 0) {
        cout << "\n No hands left: Resolving ......" << endl;
        storeResolvedHand(resolvedHand);
        resetResolvedHand();
        resetDiceValuesMap();
        historyOfRolls.clear();

        cout << "Resolved Final Values ---------------------------" << endl;
        this->diceHistoricalResolvedValues();
    }


}